

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_expressions.cpp
# Opt level: O3

ArgumentSyntax * __thiscall slang::parsing::Parser::parseArgument(Parser *this)

{
  Token openParen;
  bool bVar1;
  EmptyArgumentSyntax *pEVar2;
  OrderedArgumentSyntax *pOVar3;
  SourceLocation location;
  PropertyExprSyntax *pPVar4;
  NamedArgumentSyntax *pNVar5;
  Token TVar6;
  Token name;
  Token start;
  Token local_68;
  Token local_58;
  Token local_48;
  
  bVar1 = ParserBase::peek(&this->super_ParserBase,Comma);
  if (!bVar1) {
    bVar1 = ParserBase::peek(&this->super_ParserBase,CloseParenthesis);
    if (!bVar1) {
      bVar1 = ParserBase::peek(&this->super_ParserBase,Dot);
      if (bVar1) {
        TVar6 = ParserBase::consume(&this->super_ParserBase);
        name = ParserBase::expect(&this->super_ParserBase,Identifier);
        local_68 = ParserBase::expect(&this->super_ParserBase,OpenParenthesis);
        if ((local_68._0_4_ >> 0x10 & 1) == 0) {
          bVar1 = ParserBase::peek(&this->super_ParserBase,CloseParenthesis);
          if (bVar1) {
            pPVar4 = (PropertyExprSyntax *)0x0;
          }
          else {
            pPVar4 = parsePropertyExpr(this,0);
          }
          local_58 = ParserBase::expect(&this->super_ParserBase,CloseParenthesis);
        }
        else {
          location = Token::location(&local_68);
          local_58 = ParserBase::missingToken(&this->super_ParserBase,CloseParenthesis,location);
          pPVar4 = (PropertyExprSyntax *)0x0;
        }
        openParen = local_68;
        local_48.kind = local_68.kind;
        local_48._2_1_ = local_68._2_1_;
        local_48.numFlags.raw = local_68.numFlags.raw;
        local_48.rawLen = local_68.rawLen;
        local_48.info = local_68.info;
        local_68 = openParen;
        pNVar5 = slang::syntax::SyntaxFactory::namedArgument
                           (&this->factory,TVar6,name,openParen,pPVar4,local_58);
        return &pNVar5->super_ArgumentSyntax;
      }
      pPVar4 = parsePropertyExpr(this,0);
      pOVar3 = slang::syntax::SyntaxFactory::orderedArgument(&this->factory,pPVar4);
      return &pOVar3->super_ArgumentSyntax;
    }
  }
  TVar6 = ParserBase::placeholderToken(&this->super_ParserBase);
  pEVar2 = slang::syntax::SyntaxFactory::emptyArgument(&this->factory,TVar6);
  return &pEVar2->super_ArgumentSyntax;
}

Assistant:

ArgumentSyntax& Parser::parseArgument() {
    // check for empty arguments
    if (peek(TokenKind::Comma) || peek(TokenKind::CloseParenthesis))
        return factory.emptyArgument(placeholderToken());

    // check for named arguments
    if (peek(TokenKind::Dot)) {
        auto dot = consume();
        auto name = expect(TokenKind::Identifier);

        auto [innerOpenParen, innerCloseParen,
              expr] = parseGroupOrSkip(TokenKind::OpenParenthesis, TokenKind::CloseParenthesis,
                                       [this]() { return &parsePropertyExpr(0); });

        return factory.namedArgument(dot, name, innerOpenParen, expr, innerCloseParen);
    }

    return factory.orderedArgument(parsePropertyExpr(0));
}